

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_hmc_multiple_val.cpp
# Opt level: O2

int Molecular_Dynamics(double (*x) [3],double (*A) [3],double *ham_init,double *ham_fin)

{
  int idim_1;
  int idim;
  long lVar1;
  int step;
  int iVar2;
  double dVar3;
  double p [3];
  double r1;
  double delh [3];
  double r2;
  
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    BoxMuller(&r1,&r2);
    p[lVar1] = r1;
  }
  dVar3 = calc_hamiltonian(*x,p,A);
  *ham_init = dVar3;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    (*x)[lVar1] = p[lVar1] * 0.5 + (*x)[lVar1];
  }
  iVar2 = 1;
  while( true ) {
    calc_delh(*x,A,&delh);
    lVar1 = 0;
    if (iVar2 == 0x28) break;
    for (; lVar1 != 3; lVar1 = lVar1 + 1) {
      p[lVar1] = p[lVar1] - delh[lVar1];
    }
    for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
      (*x)[lVar1] = p[lVar1] + (*x)[lVar1];
    }
    iVar2 = iVar2 + 1;
  }
  for (; lVar1 != 3; lVar1 = lVar1 + 1) {
    p[lVar1] = p[lVar1] - delh[lVar1];
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    (*x)[lVar1] = p[lVar1] * 0.5 + (*x)[lVar1];
  }
  dVar3 = calc_hamiltonian(*x,p,A);
  *ham_fin = dVar3;
  return 0;
}

Assistant:

int Molecular_Dynamics(double (&x)[ndim], const double A[ndim][ndim], double &ham_init,
                       double &ham_fin) {
    double p[ndim];
    double delh[ndim];
    double r1, r2;
    for (int idim = 0; idim < ndim; idim++) {
        BoxMuller(r1, r2);
        p[idim] = r1;
    }
    ham_init = calc_hamiltonian(x, p, A);

    for (int idim = 0; idim < ndim; idim++) {
        x[idim] += p[idim] * 0.5e0 * dtau;
    }

    for (int step = 1; step < ntau; step++) {
        calc_delh(x, A, delh);
        for (int idim = 0; idim < ndim; idim++) {
            p[idim] -= delh[idim] * dtau;
        }
        for (int idim = 0; idim < ndim; idim++) {
            x[idim] += p[idim] * dtau;
        }
    }
    calc_delh(x, A, delh);
    for (int idim = 0; idim < ndim; idim++) {
        p[idim] -= delh[idim] * dtau;
    }
    for (int idim = 0; idim < ndim; idim++) {
        x[idim] += p[idim] * 0.5e0 * dtau;
    }

    ham_fin = calc_hamiltonian(x, p, A);
    return 0;
}